

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::BufferRangeErrorsTest::iterate(BufferRangeErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  int local_54;
  GLint gl_texture_buffer_offset_alignment;
  GLuint not_a_buffer;
  GLuint not_a_texture;
  int local_3c;
  int local_38;
  GLuint buffer;
  GLuint texture_1D;
  GLuint texture_buffer;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  BufferRangeErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar3);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar5->_vptr_RenderContext[2])();
  texture_buffer = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)texture_buffer);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  texture_1D._3_1_ = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)texture_1D._3_1_)) {
    texture_1D._2_1_ = 1;
    texture_1D._1_1_ = 0;
    buffer = 0;
    local_38 = 0;
    local_3c = 0;
    (**(code **)(lStack_20 + 0x400))(0x8c2a,1,&buffer);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glCreateTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x200b);
    (**(code **)(lStack_20 + 0x400))(0xde0,1,&local_38);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glCreateTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x200e);
    (**(code **)(lStack_20 + 0x3b8))(1,&local_3c);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glCreateBuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2011);
    (**(code **)(lStack_20 + 0xec0))(local_3c,4,"\x01\x02\x03\x04",0x88e6);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glNamedBufferData has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2014);
    gl_texture_buffer_offset_alignment = 0;
    do {
      gl_texture_buffer_offset_alignment = gl_texture_buffer_offset_alignment + 1;
      cVar1 = (**(code **)(lStack_20 + 0xcc8))();
    } while (cVar1 != '\0');
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glIsTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x201d);
    (**(code **)(lStack_20 + 0x13e0))(gl_texture_buffer_offset_alignment,0x8058,local_3c,0,4);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                       "glTextureBufferRange",
                       "texture is not the name of an existing texture object.");
    texture_1D._2_1_ = bVar2 & texture_1D._2_1_;
    (**(code **)(lStack_20 + 0x13e0))(local_38,0x8058,local_3c,0,4);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                       "glTextureBufferRange",
                       "the effective target of texture is not TEXTURE_BUFFER.");
    texture_1D._2_1_ = bVar2 & texture_1D._2_1_;
    (**(code **)(lStack_20 + 0x13e0))(buffer,0x8dbc,local_3c,0,4);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                       "glTextureBufferRange",
                       "internalformat is not one of the supported sized internal formats.");
    texture_1D._2_1_ = (texture_1D._2_1_ & 1 & bVar2) != 0;
    local_54 = 0;
    do {
      local_54 = local_54 + 1;
      cVar1 = (**(code **)(lStack_20 + 0xc68))();
    } while (cVar1 != '\0');
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glIsBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x203e);
    (**(code **)(lStack_20 + 0x13e0))(buffer,0x8058,local_54,0,4);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                       "glTextureBufferRange",
                       "buffer is not zero and is not the name of an existing buffer object.");
    texture_1D._2_1_ = bVar2 & texture_1D._2_1_;
    (**(code **)(lStack_20 + 0x13e0))(buffer,0x8058,local_3c,0xffffffffffffffff,4);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                       "glTextureBufferRange","offset is negative.");
    texture_1D._2_1_ = bVar2 & texture_1D._2_1_;
    (**(code **)(lStack_20 + 0x13e0))(buffer,0x8058,local_3c,0);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                       "glTextureBufferRange","size is zero.");
    texture_1D._2_1_ = bVar2 & texture_1D._2_1_;
    (**(code **)(lStack_20 + 0x13e0))(buffer,0x8058,local_3c,0,0xffffffffffffffff);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                       "glTextureBufferRange","size is negative.");
    texture_1D._2_1_ = bVar2 & texture_1D._2_1_;
    (**(code **)(lStack_20 + 0x13e0))(buffer,0x8058,local_3c,0,0x40);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                       "glTextureBufferRange",
                       "size is greater than the value of BUFFER_SIZE for buffer.");
    texture_1D._2_1_ = bVar2 & texture_1D._2_1_;
    (**(code **)(lStack_20 + 0x868))(0x919f);
    if (local_38 != 0) {
      (**(code **)(lStack_20 + 0x480))(1);
    }
    if (buffer != 0) {
      (**(code **)(lStack_20 + 0x480))(1);
    }
    if (local_3c != 0) {
      (**(code **)(lStack_20 + 0x438))(1);
    }
    do {
      iVar3 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar3 != 0);
    if ((texture_1D._2_1_ & 1) == 0) {
      if ((texture_1D._1_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult BufferRangeErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Textures' objects */
	glw::GLuint texture_buffer = 0;
	glw::GLuint texture_1D	 = 0;
	glw::GLuint buffer		   = 0;

	static const glw::GLubyte data[4]   = { 1, 2, 3, 4 };
	static const glw::GLuint  data_size = sizeof(data);

	try
	{
		/* Auxiliary objects setup. */
		gl.createTextures(GL_TEXTURE_BUFFER, 1, &texture_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

		gl.createTextures(GL_TEXTURE_1D, 1, &texture_1D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers has failed");

		gl.namedBufferData(buffer, data_size, data, GL_STATIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData has failed");

		/*  Check that INVALID_OPERATION is generated by TextureBufferRange if
		 texture is not the name of an existing texture object.*/
		{
			glw::GLuint not_a_texture = 0;

			while (gl.isTexture(++not_a_texture))
				;
			GLU_EXPECT_NO_ERROR(gl.getError(), "glIsTexture has failed");

			gl.textureBufferRange(not_a_texture, GL_RGBA8, buffer, 0, data_size);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureBufferRange",
									  "texture is not the name of an existing texture object.");
		}

		/*  Check that INVALID_ENUM is generated by TextureBufferRange if the
		 effective target of texture is not TEXTURE_BUFFER. */
		{
			gl.textureBufferRange(texture_1D, GL_RGBA8, buffer, 0, data_size);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureBufferRange",
									  "the effective target of texture is not TEXTURE_BUFFER.");
		}

		/*  Check that INVALID_ENUM is generated by TextureBufferRange if
		 internalformat is not one of the sized internal formats described above. */
		{
			gl.textureBufferRange(texture_buffer, GL_COMPRESSED_SIGNED_RED_RGTC1, buffer, 0, data_size);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureBufferRange",
									  "internalformat is not one of the supported sized internal formats.");
		}

		/*  Check that INVALID_OPERATION is generated by TextureBufferRange if
		 buffer is not zero and is not the name of an existing buffer object. */
		{
			glw::GLuint not_a_buffer = 0;

			while (gl.isBuffer(++not_a_buffer))
				;
			GLU_EXPECT_NO_ERROR(gl.getError(), "glIsBuffer has failed");

			gl.textureBufferRange(texture_buffer, GL_RGBA8, not_a_buffer, 0, data_size);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureBufferRange",
									  "buffer is not zero and is not the name of an existing buffer object.");
		}

		/* Check that INVALID_VALUE is generated by TextureBufferRange if offset
		 is negative, if size is less than or equal to zero, or if offset + size
		 is greater than the value of BUFFER_SIZE for buffer. */
		{
			gl.textureBufferRange(texture_buffer, GL_RGBA8, buffer, -1, data_size);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureBufferRange", "offset is negative.");

			gl.textureBufferRange(texture_buffer, GL_RGBA8, buffer, 0, 0);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureBufferRange", "size is zero.");

			gl.textureBufferRange(texture_buffer, GL_RGBA8, buffer, 0, -1);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureBufferRange", "size is negative.");

			gl.textureBufferRange(texture_buffer, GL_RGBA8, buffer, 0, data_size * 16);

			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureBufferRange",
									  "size is greater than the value of BUFFER_SIZE for buffer.");
		}

		/* Check that INVALID_VALUE is generated by TextureBufferRange if offset is
		 not an integer multiple of the value of TEXTURE_BUFFER_OFFSET_ALIGNMENT. */
		{
			glw::GLint gl_texture_buffer_offset_alignment = 0;

			gl.getIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT, &gl_texture_buffer_offset_alignment);

			/* If alignmet is 1 we cannot do anything. Error situtation is impossible then. */
			if (gl_texture_buffer_offset_alignment > 1)
			{
				gl.textureBufferRange(texture_buffer, GL_RGBA8, buffer, 1, data_size - 1);

				is_ok &= CheckErrorAndLog(
					m_context, GL_INVALID_VALUE, "glTextureBufferRange",
					"offset is not an integer multiple of the value of TEXTURE_BUFFER_OFFSET_ALIGNMENT.");
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture_1D)
	{
		gl.deleteTextures(1, &texture_1D);
	}

	if (texture_buffer)
	{
		gl.deleteTextures(1, &texture_buffer);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}